

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)14,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  StrWriter *this_00;
  char cVar7;
  UInt u;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  iVar4 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  u.raw = iVar4 * 0x10000 + uVar1 + 2 + (uVar5 & 0xffff);
  SVar2 = str->style->syntax;
  if (1 < SVar2 - GNU) {
    cVar7 = 'b';
    if (SVar2 == MUSASHI) {
      lVar6 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar7;
        cVar7 = "fdbeq"[lVar6 + 2];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      }
      else {
        iVar4 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar4);
      }
      StrWriter::operator<<(str,u);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        cVar7 = ';';
        lVar6 = 1;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = cVar7;
          cVar7 = "trap%-2s  ; (2+)"[lVar6 + 10];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
    }
    else {
      lVar6 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar7;
        cVar7 = "fdbeq"[lVar6 + 2];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      }
      else {
        iVar4 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar4);
      }
      StrWriter::operator<<(str,u);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        cVar7 = ';';
        lVar6 = 1;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = cVar7;
          cVar7 = "trap%-2s  ; (2+)"[lVar6 + 10];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
    }
    return;
  }
  cVar7 = 'b';
  lVar6 = 1;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar7;
    cVar7 = "fdbeq"[lVar6 + 2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  this_00 = StrWriter::operator<<(str);
  if ((this_00->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar3 = this_00->ptr;
    this_00->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  else {
    iVar4 = (str->tab).raw;
    do {
      pcVar3 = this_00->ptr;
      this_00->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    } while (this_00->ptr < this_00->base + iVar4);
  }
  StrWriter::operator<<(this_00,u);
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}